

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O0

ssize_t __thiscall
HttpHeaderBase::send(HttpHeaderBase *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  ssize_t sVar2;
  long lVar3;
  void *pvVar4;
  void *__src;
  size_t __n_00;
  int iVar5;
  void *extraout_RDX;
  undefined4 in_register_00000034;
  undefined1 auVar6 [16];
  int res;
  uint8_t *temp;
  int len_local;
  uint8_t *data_local;
  IReaderWriter *writer_local;
  HttpHeaderBase *this_local;
  
  iVar5 = (int)__n;
  auVar6 = std::__cxx11::string::empty();
  pvVar4 = auVar6._8_8_;
  if ((auVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    buildHeader(this);
    pvVar4 = extraout_RDX;
  }
  if (__buf == (void *)0x0) {
    sVar2 = send(this,__fd,pvVar4,__n,__flags);
    this_local._4_4_ = (uint)sVar2;
  }
  else {
    lVar3 = std::__cxx11::string::size();
    pvVar4 = operator_new__(lVar3 + iVar5,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpHeaderBase.cpp"
                            ,0x6b);
    __src = (void *)std::__cxx11::string::c_str();
    __n_00 = std::__cxx11::string::size();
    memcpy(pvVar4,__src,__n_00);
    lVar3 = std::__cxx11::string::size();
    memcpy((void *)((long)pvVar4 + lVar3),__buf,(long)iVar5);
    iVar1 = std::__cxx11::string::size();
    this_local._4_4_ =
         (**(code **)(*(long *)CONCAT44(in_register_00000034,__fd) + 0x18))
                   ((long *)CONCAT44(in_register_00000034,__fd),pvVar4,iVar1 + iVar5);
    if (pvVar4 != (void *)0x0) {
      operator_delete__(pvVar4);
    }
  }
  return (ulong)this_local._4_4_;
}

Assistant:

int HttpHeaderBase::send(IReaderWriter *writer, const uint8_t* data, int len) const
{
	TRACE_BEGIN(LOG_LVL_INFO);
	
	if (mHeaderStr.empty())
	{
		buildHeader();
	}
	
	if (not data) 
	{
		return send(writer);
	}
	
	uint8_t* temp = jh_new uint8_t[mHeaderStr.size() + len];
	memcpy(temp, mHeaderStr.c_str(), mHeaderStr.size());
	memcpy(temp + mHeaderStr.size(), data, len);
	
	int res = writer->write(temp, mHeaderStr.size() + len);
	delete[] temp;
	return res;
}